

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::Write
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,TPZStream *buf,int withclassid)

{
  bool bVar1;
  undefined4 uVar2;
  long *plVar3;
  TPZStream *this_00;
  size_type sVar4;
  TPZVec<int> *in_RSI;
  long *in_RDI;
  TPZStream *in_stack_00000028;
  TPZOneShapeRestraint *in_stack_00000030;
  int classid;
  const_iterator it;
  int sz;
  TPZManVector<int,_3> order;
  TPZVec<int> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  TPZVec<int> *in_stack_ffffffffffffff58;
  TPZVec<int> *pTVar5;
  TPZStream *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  _Self local_70;
  _Self local_68;
  undefined4 local_60 [5];
  undefined4 local_4c;
  undefined1 local_48 [56];
  TPZVec<int> *local_10;
  
  local_10 = in_RSI;
  TPZInterpolatedElement::Write
            ((TPZInterpolatedElement *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
             ,(TPZStream *)in_stack_ffffffffffffff48,0);
  pTVar5 = local_10;
  plVar3 = TPZVec<long>::begin((TPZVec<long> *)(in_RDI + 0x12));
  (*pTVar5->_vptr_TPZVec[5])(pTVar5,plVar3,7);
  local_4c = 0;
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (int64_t)local_48,(int *)in_RDI);
  TPZIntTriang::GetOrder
            ((TPZIntTriang *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  TPZStream::Write<int>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  TPZStream::Write<int>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  pTVar5 = local_10;
  this_00 = (TPZStream *)TPZVec<long>::begin((TPZVec<long> *)(in_RDI + 0x12));
  (*pTVar5->_vptr_TPZVec[5])(pTVar5,this_00,7);
  (*local_10->_vptr_TPZVec[3])(local_10,in_RDI + 5,1);
  TPZStream::Write<int>(this_00,pTVar5);
  sVar4 = std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::size
                    ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_60[0] = (undefined4)sVar4;
  (*local_10->_vptr_TPZVec[3])(local_10,local_60,1);
  local_68._M_node =
       (_List_node_base *)
       std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::begin
                 ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                  in_stack_ffffffffffffff48);
  while( true ) {
    local_70._M_node =
         (_List_node_base *)
         std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::end
                   ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                    in_stack_ffffffffffffff48);
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    std::_List_const_iterator<TPZOneShapeRestraint>::operator->
              ((_List_const_iterator<TPZOneShapeRestraint> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    TPZOneShapeRestraint::Write(in_stack_00000030,in_stack_00000028);
    std::_List_const_iterator<TPZOneShapeRestraint>::operator++(&local_68,0);
  }
  uVar2 = (**(code **)(*in_RDI + 0x20))();
  (*local_10->_vptr_TPZVec[3])(local_10,&stack0xffffffffffffff84,1);
  TPZManVector<int,_3>::~TPZManVector
            ((TPZManVector<int,_3> *)CONCAT44(uVar2,in_stack_ffffffffffffff50));
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Write(TPZStream &buf, int withclassid) const
{
	TPZInterpolatedElement::Write(buf,withclassid);
  buf.Write(fConnectIndexes.begin(),TSHAPE::NSides);
	TPZManVector<int,3> order(3,0);
	this->fIntRule.GetOrder(order);
	buf.Write(order);
    buf.Write(fSideOrient);

	buf.Write(this->fConnectIndexes.begin(),TSHAPE::NSides);
	buf.Write(&this->fPreferredOrder,1);
    buf.Write(fSideOrient);
    int sz = fRestraints.size();
    buf.Write(&sz);
    for (std::list<TPZOneShapeRestraint>::const_iterator it = fRestraints.begin(); it != fRestraints.end(); it++) {
        it->Write(buf);
    }
	int classid = this->ClassId();
	buf.Write ( &classid, 1 );
}